

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ManAppendAnd2(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  
  if (p->fGiaSimple == 0) {
    iVar1 = iLit0;
    if (iLit0 < 2) {
      iVar1 = iLit1;
      if (iLit0 == 0) {
        iVar1 = iLit0;
      }
    }
    else if (iLit1 < 2) {
      if (iLit1 == 0) {
        iVar1 = iLit1;
      }
    }
    else if (iLit0 != iLit1) {
      iVar2 = Abc_LitNot(iLit1);
      iVar1 = 0;
      if (iVar2 != iLit0) goto LAB_0059cc05;
    }
    return iVar1;
  }
LAB_0059cc05:
  iVar1 = Gia_ManAppendAnd(p,iLit0,iLit1);
  return iVar1;
}

Assistant:

static inline int Gia_ManAppendAnd2( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( !p->fGiaSimple )
    {
        if ( iLit0 < 2 )
            return iLit0 ? iLit1 : 0;
        if ( iLit1 < 2 )
            return iLit1 ? iLit0 : 0;
        if ( iLit0 == iLit1 )
            return iLit1;
        if ( iLit0 == Abc_LitNot(iLit1) )
            return 0;
    }
    return Gia_ManAppendAnd( p, iLit0, iLit1 );
}